

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfOutputSetFrameBuffer(ImfOutputFile *out,ImfRgba *base,size_t xStride,size_t yStride)

{
  ImfOutputFile *in_RDI;
  exception *e;
  size_t in_stack_00000108;
  size_t in_stack_00000110;
  Rgba *in_stack_00000118;
  RgbaOutputFile *in_stack_00000120;
  
  anon_unknown.dwarf_572a3::outfile(in_RDI);
  Imf_3_2::RgbaOutputFile::setFrameBuffer
            (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  return 1;
}

Assistant:

int
ImfOutputSetFrameBuffer (
    ImfOutputFile* out, const ImfRgba* base, size_t xStride, size_t yStride)
{
    try
    {
        outfile (out)->setFrameBuffer (
            (OPENEXR_IMF_INTERNAL_NAMESPACE::Rgba*) base, xStride, yStride);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}